

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O1

Ptr * __thiscall
spectest::CommandRunner::ReadModule
          (Ptr *__return_storage_ptr__,CommandRunner *this,string_view module_filename,
          Errors *errors)

{
  Result RVar1;
  pointer __dest;
  ulong uVar2;
  size_t __n;
  string_view filename;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  ModuleDesc module_desc;
  ReadBinaryOptions options;
  void *local_2a8;
  long lStack_2a0;
  undefined8 local_298;
  ModuleDesc local_290;
  ModuleDesc local_170;
  ReadBinaryOptions local_50;
  
  local_2a8 = (void *)0x0;
  lStack_2a0 = 0;
  local_298 = 0;
  filename.size_ = (size_type)&local_2a8;
  filename.data_ = (char *)module_filename.size_;
  RVar1 = wabt::ReadFile((wabt *)module_filename.data_,filename,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         module_filename.size_);
  if (RVar1.enum_ == Error) {
    __return_storage_ptr__->obj_ = (Module *)0x0;
    __return_storage_ptr__->store_ = (Store *)0x0;
    __return_storage_ptr__->root_index_ = 0;
  }
  else {
    local_50.features.exceptions_enabled_ = s_features.exceptions_enabled_;
    local_50.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
    local_50.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
    local_50.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
    local_50.features.simd_enabled_ = s_features.simd_enabled_;
    local_50.features.threads_enabled_ = s_features.threads_enabled_;
    local_50.features.multi_value_enabled_ = s_features.multi_value_enabled_;
    local_50.features.tail_call_enabled_ = s_features.tail_call_enabled_;
    local_50.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
    local_50.features.reference_types_enabled_ = s_features.reference_types_enabled_;
    local_50.features.annotations_enabled_ = s_features.annotations_enabled_;
    local_50.features.gc_enabled_ = s_features.gc_enabled_;
    local_50.features.memory64_enabled_ = s_features.memory64_enabled_;
    local_50.log_stream =
         (Stream *)
         s_log_stream._M_t.
         super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
         super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
         super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
    local_50.read_debug_names = true;
    local_50.stop_on_first_error = true;
    local_50.fail_on_custom_section_error = true;
    memset(&local_170,0,0x120);
    RVar1 = wabt::interp::ReadBinaryInterp
                      (local_2a8,lStack_2a0 - (long)local_2a8,&local_50,errors,&local_170);
    if (RVar1.enum_ == Error) {
      __return_storage_ptr__->obj_ = (Module *)0x0;
      __return_storage_ptr__->store_ = (Store *)0x0;
      __return_storage_ptr__->root_index_ = 0;
    }
    else {
      if (s_verbose != 0) {
        wabt::interp::Istream::Disassemble
                  (&local_170.istream,
                   (Stream *)
                   s_stdout_stream._M_t.
                   super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                   .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl);
      }
      std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::vector
                (&local_290.func_types,&local_170.func_types);
      std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::vector
                (&local_290.imports,&local_170.imports);
      std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>::vector
                (&local_290.funcs,&local_170.funcs);
      std::vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>::vector
                (&local_290.tables,&local_170.tables);
      std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>::vector
                (&local_290.memories,&local_170.memories);
      std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>::vector
                (&local_290.globals,&local_170.globals);
      std::vector<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>::vector
                (&local_290.events,&local_170.events);
      std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>::vector
                (&local_290.exports,&local_170.exports);
      std::vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>::vector
                (&local_290.starts,&local_170.starts);
      std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>::vector
                (&local_290.elems,&local_170.elems);
      std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>::vector
                (&local_290.datas,&local_170.datas);
      local_290.istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_290.istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_290.istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar2 = (long)local_170.istream.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_170.istream.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if (uVar2 == 0) {
        __dest = (pointer)0x0;
      }
      else {
        if ((long)uVar2 < 0) {
          std::__throw_bad_alloc();
        }
        __dest = (pointer)operator_new(uVar2);
      }
      local_290.istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = __dest + uVar2;
      __n = (long)local_170.istream.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_170.istream.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_290.istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = __dest;
      if (__n != 0) {
        local_290.istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = __dest;
        memmove(__dest,local_170.istream.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,__n);
      }
      local_290.istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = __dest + __n;
      wabt::interp::Store::Alloc<wabt::interp::Module,wabt::interp::Store&,wabt::interp::ModuleDesc>
                (__return_storage_ptr__,&this->store_,&this->store_,&local_290);
      wabt::interp::ModuleDesc::~ModuleDesc(&local_290);
    }
    wabt::interp::ModuleDesc::~ModuleDesc(&local_170);
  }
  if (local_2a8 != (void *)0x0) {
    operator_delete(local_2a8);
  }
  return __return_storage_ptr__;
}

Assistant:

interp::Module::Ptr CommandRunner::ReadModule(string_view module_filename,
                                               Errors* errors) {
  std::vector<uint8_t> file_data;

  if (Failed(ReadFile(module_filename, &file_data))) {
    return {};
  }

  const bool kReadDebugNames = true;
  const bool kStopOnFirstError = true;
  const bool kFailOnCustomSectionError = true;
  ReadBinaryOptions options(s_features, s_log_stream.get(), kReadDebugNames,
                            kStopOnFirstError, kFailOnCustomSectionError);
  ModuleDesc module_desc;
  if (Failed(ReadBinaryInterp(file_data.data(), file_data.size(), options,
                              errors, &module_desc))) {
    return {};
  }

  if (s_verbose) {
    module_desc.istream.Disassemble(s_stdout_stream.get());
  }

  return interp::Module::New(store_, module_desc);
}